

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

int setsbf(match *res,int pos,int len,ull num)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  if (len == 0) {
    return 1;
  }
  iVar1 = pos + 0x3f;
  if (-1 < pos) {
    iVar1 = pos;
  }
  uVar4 = ~(-1L << ((byte)len & 0x3f));
  bVar2 = (byte)(pos % 0x40);
  uVar6 = uVar4 << (bVar2 & 0x3f);
  uVar3 = (num & uVar4) << (bVar2 & 0x3f);
  lVar5 = (long)(iVar1 >> 6);
  iVar1 = 0;
  if (((res->a[lVar5] & uVar6 ^ uVar3) & res->m[lVar5]) == 0) {
    res->a[lVar5] = res->a[lVar5] | uVar3;
    res->m[lVar5] = res->m[lVar5] | uVar6;
    if (0x40 < len + pos % 0x40) {
      uVar6 = uVar4 >> (-bVar2 & 0x3f);
      uVar3 = (num & uVar4) >> (-bVar2 & 0x3f);
      if (((res->a[lVar5 + 1] & uVar6 ^ uVar3) & res->m[lVar5 + 1]) != 0) {
        return 0;
      }
      res->a[lVar5 + 1] = res->a[lVar5 + 1] | uVar3;
      res->m[lVar5 + 1] = res->m[lVar5 + 1] | uVar6;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int setsbf (struct match *res, int pos, int len, ull num) {
	if (!len)
		return 1;
	int idx = pos / 0x40;
	pos %= 0x40;
	ull m = ((1ull << len) - 1) << pos;
	ull a = (num << pos) & m;
	if ((a & m & res->m[idx]) == (res->a[idx] & m & res->m[idx])) {
		res->a[idx] |= a;
		res->m[idx] |= m;
	} else {
		return 0;
	}
	if (pos + len > 0x40) {
		ull m1 = (((1ull << len) - 1) >> (0x40 - pos));
		ull a1 = (num >> (0x40 - pos)) & m1;
		if ((a1 & m1 & res->m[idx+1]) == (res->a[idx+1] & m1 & res->m[idx+1])) {
			res->a[idx+1] |= a1;
			res->m[idx+1] |= m1;
		} else {
			return 0;
		}
	}
	return 1;
}